

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_Engine::pop_function_call
          (Dispatch_Engine *this,Stack_Holder *t_s,Conversion_Saves *t_saves)

{
  reference this_00;
  Conversion_Saves *t_saves_local;
  Stack_Holder *t_s_local;
  Dispatch_Engine *this_local;
  
  t_s->call_depth = t_s->call_depth + -1;
  if (-1 < t_s->call_depth) {
    if (t_s->call_depth == 0) {
      this_00 = Catch::clara::std::
                vector<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_std::allocator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
                ::back(&t_s->call_params);
      Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
      clear(this_00);
      Type_Conversions::enable_conversion_saves(t_saves,false);
    }
    return;
  }
  __assert_fail("t_s.call_depth >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/dispatchkit.hpp"
                ,0x3ee,
                "void chaiscript::detail::Dispatch_Engine::pop_function_call(Stack_Holder &, Type_Conversions::Conversion_Saves &)"
               );
}

Assistant:

void pop_function_call(Stack_Holder &t_s, Type_Conversions::Conversion_Saves &t_saves) {
        --t_s.call_depth;

        assert(t_s.call_depth >= 0);

        if (t_s.call_depth == 0) {
          t_s.call_params.back().clear();
          m_conversions.enable_conversion_saves(t_saves, false);
        }
      }